

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void ReportHeader(lemon *lemp)

{
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  bool bVar4;
  uint local_80c;
  int nextChar;
  int i;
  char pattern [1000];
  char local_418 [8];
  char line [1000];
  char *local_28;
  char *prefix;
  FILE *in;
  FILE *out;
  lemon *lemp_local;
  
  if (lemp->tokenprefix == (char *)0x0) {
    local_28 = "";
  }
  else {
    local_28 = lemp->tokenprefix;
  }
  pFVar2 = (FILE *)file_open(lemp,".h","rb");
  if (pFVar2 != (FILE *)0x0) {
    local_80c = 1;
    while( true ) {
      bVar4 = false;
      if ((int)local_80c < lemp->nterminal) {
        pcVar3 = fgets(local_418,1000,pFVar2);
        bVar4 = pcVar3 != (char *)0x0;
      }
      if (!bVar4) break;
      sprintf((char *)&nextChar,"#define %s%-30s %2d\n",local_28,lemp->symbols[(int)local_80c]->name
              ,(ulong)local_80c);
      iVar1 = strcmp(local_418,(char *)&nextChar);
      if (iVar1 != 0) break;
      local_80c = local_80c + 1;
    }
    fgetc(pFVar2);
    fclose(pFVar2);
  }
  pFVar2 = (FILE *)file_open(lemp,".h","wb");
  if (pFVar2 != (FILE *)0x0) {
    for (local_80c = 1; (int)local_80c < lemp->nterminal; local_80c = local_80c + 1) {
      fprintf(pFVar2,"#define %s%-30s %3d\n",local_28,lemp->symbols[(int)local_80c]->name,
              (ulong)local_80c);
    }
    fclose(pFVar2);
  }
  return;
}

Assistant:

void ReportHeader(struct lemon *lemp)
{
  FILE *out, *in;
  const char *prefix;
  char line[LINESIZE];
  char pattern[LINESIZE];
  int i;

  if( lemp->tokenprefix ) prefix = lemp->tokenprefix;
  else                    prefix = "";
  in = file_open(lemp,".h","rb");
  if( in ){
    int nextChar;
    for(i=1; i<lemp->nterminal && fgets(line,LINESIZE,in); i++){
      sprintf(pattern,"#define %s%-30s %2d\n",
              prefix,lemp->symbols[i]->name,i);
      if( strcmp(line,pattern) ) break;
    }
    nextChar = fgetc(in);
    fclose(in);
    if( i==lemp->nterminal && nextChar==EOF ){
      /* No change in the file.  Don't rewrite it. */
      /* (not the best idea if you use make tools that check the date! */
      /*return;*/
    }
  }
  out = file_open(lemp,".h","wb");
  if( out ){
    for(i=1; i<lemp->nterminal; i++){
      fprintf(out,"#define %s%-30s %3d\n",prefix,lemp->symbols[i]->name,i);
    }
    fclose(out);  
  }
  return;
}